

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

IteratedLogicalExpr __thiscall
ExprTest::MakeIteratedLogical<3>(ExprTest *this,Kind kind,LogicalExpr (*args) [3])

{
  IteratedLogicalExprBuilder builder_00;
  ExprBase arg;
  IteratedLogicalExpr IVar1;
  long in_RDX;
  IteratedLogicalExprBuilder IVar2;
  int i;
  IteratedLogicalExprBuilder builder;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  int in_stack_ffffffffffffffc8;
  Kind in_stack_ffffffffffffffcc;
  BasicExprFactory<std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined4 uStack_24;
  
  IVar2 = mp::BasicExprFactory<std::allocator<char>_>::BeginIteratedLogical
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  arg.impl_ = &(IVar2.impl_)->super_Impl;
  for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffffb0 = *(undefined8 *)(in_RDX + (long)iVar3 * 8);
    mp::BasicExprFactory<std::allocator<char>_>::
    BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
    ::AddArg((BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
              *)CONCAT44(iVar3,in_stack_ffffffffffffffb8),(Arg)arg.impl_);
  }
  builder_00.arg_index_ = in_stack_ffffffffffffffb8;
  builder_00.impl_ = (Impl *)in_stack_ffffffffffffffb0;
  builder_00._12_4_ = iVar3;
  IVar1 = mp::BasicExprFactory<std::allocator<char>_>::EndIteratedLogical
                    ((BasicExprFactory<std::allocator<char>_> *)CONCAT44(uStack_24,IVar2.arg_index_)
                     ,builder_00);
  return (BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>)
         IVar1.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_;
}

Assistant:

mp::IteratedLogicalExpr MakeIteratedLogical(
      expr::Kind kind, LogicalExpr (&args)[N]) {
    auto builder = factory_.BeginIteratedLogical(kind, N);
    for (int i = 0; i < N; ++i)
      builder.AddArg(args[i]);
    return factory_.EndIteratedLogical(builder);
  }